

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_impl.hpp
# Opt level: O0

void __thiscall Catch::TestRunStats::~TestRunStats(TestRunStats *this)

{
  TestRunStats *this_local;
  
  ~TestRunStats(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

TestRunStats::~TestRunStats() {}